

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListModel::clear(QListModel *this)

{
  QList<QListWidgetItem_*> *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  long in_RDI;
  int i;
  QListWidgetItem *in_stack_ffffffffffffffd8;
  int local_c;
  
  QAbstractItemModel::beginResetModel();
  local_c = 0;
  while( true ) {
    this_00 = (QList<QListWidgetItem_*> *)(long)local_c;
    qVar1 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)(in_RDI + 0x10));
    if (qVar1 <= (long)this_00) break;
    ppQVar2 = QList<QListWidgetItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffd8);
    if (*ppQVar2 != (QListWidgetItem *)0x0) {
      ppQVar2 = QList<QListWidgetItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffd8);
      (*ppQVar2)->d->theid = -1;
      ppQVar2 = QList<QListWidgetItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffd8);
      (*ppQVar2)->view = (QListWidget *)0x0;
      ppQVar2 = QList<QListWidgetItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffd8 = *ppQVar2;
      if (in_stack_ffffffffffffffd8 != (QListWidgetItem *)0x0) {
        (*in_stack_ffffffffffffffd8->_vptr_QListWidgetItem[1])();
      }
    }
    local_c = local_c + 1;
  }
  QList<QListWidgetItem_*>::clear(this_00);
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void QListModel::clear()
{
    beginResetModel();
    for (int i = 0; i < items.size(); ++i) {
        if (items.at(i)) {
            items.at(i)->d->theid = -1;
            items.at(i)->view = nullptr;
            delete items.at(i);
        }
    }
    items.clear();
    endResetModel();
}